

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

IterateResult __thiscall gl4cts::GPUShaderFP64Test8::iterate(GPUShaderFP64Test8 *this)

{
  _variable_type _Var1;
  bool bVar2;
  NotSupportedError *this_00;
  long lVar3;
  char *pcVar4;
  pointer __x;
  _variable_type variable_type;
  long local_138;
  _argument_lists argument_lists;
  _test_case test_case;
  
  pcVar4 = "GL_ARB_gpu_shader_fp64";
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_gpu_shader_fp64");
  if (bVar2) {
    initTest(this);
    lVar3 = 0;
    while (lVar3 != 0xd) {
      _Var1 = (&DAT_0168e070)[lVar3];
      variable_type = _Var1;
      local_138 = lVar3;
      getArgumentListsForVariableType(&argument_lists,(GPUShaderFP64Test8 *)pcVar4,&variable_type);
      for (__x = argument_lists.
                 super__Vector_base<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>,_std::allocator<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          __x != argument_lists.
                 super__Vector_base<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>,_std::allocator<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
        test_case.argument_list.
        super__Vector_base<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        test_case.argument_list.
        super__Vector_base<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        test_case.argument_list.
        super__Vector_base<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        test_case.cs_shader_body._M_dataplus._M_p = (pointer)&test_case.cs_shader_body.field_2;
        test_case.cs_shader_body._M_string_length = 0;
        test_case.cs_shader_body.field_2._M_local_buf[0] = '\0';
        test_case.fs_shader_body._M_dataplus._M_p = (pointer)&test_case.fs_shader_body.field_2;
        test_case.fs_shader_body._M_string_length = 0;
        test_case.fs_shader_body.field_2._M_local_buf[0] = '\0';
        test_case.gs_shader_body._M_dataplus._M_p = (pointer)&test_case.gs_shader_body.field_2;
        test_case.gs_shader_body._M_string_length = 0;
        test_case.gs_shader_body.field_2._M_local_buf[0] = '\0';
        test_case.tc_shader_body._M_dataplus._M_p = (pointer)&test_case.tc_shader_body.field_2;
        test_case.tc_shader_body._M_string_length = 0;
        test_case.tc_shader_body.field_2._M_local_buf[0] = '\0';
        test_case.te_shader_body._M_dataplus._M_p = (pointer)&test_case.te_shader_body.field_2;
        test_case.te_shader_body._M_string_length = 0;
        test_case.te_shader_body.field_2._M_local_buf[0] = '\0';
        test_case.vs_shader_body._M_string_length = 0;
        test_case.vs_shader_body.field_2._M_local_buf[0] = '\0';
        test_case.vs_shader_body._M_dataplus._M_p = (pointer)&test_case.vs_shader_body.field_2;
        std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>::
        operator=(&test_case.argument_list,__x);
        test_case.type = _Var1;
        initIteration(this,&test_case);
        pcVar4 = (char *)&test_case;
        bVar2 = executeIteration(this,&test_case);
        this->m_has_test_passed = (bool)(this->m_has_test_passed & bVar2);
        _test_case::~_test_case(&test_case);
      }
      std::
      vector<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>,_std::allocator<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>_>_>
      ::~vector(&argument_lists);
      lVar3 = local_138 + 1;
    }
    bVar2 = this->m_has_test_passed == false;
    if (bVar2) {
      pcVar4 = "Fail";
    }
    else {
      pcVar4 = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)bVar2,pcVar4);
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_case,"GL_ARB_gpu_shader_fp64 is not supported.",
             (allocator<char> *)&argument_lists);
  tcu::NotSupportedError::NotSupportedError(this_00,(string *)&test_case);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult GPUShaderFP64Test8::iterate()
{
	/* Do not execute the test if GL_ARB_texture_view is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_gpu_shader_fp64"))
	{
		throw tcu::NotSupportedError("GL_ARB_gpu_shader_fp64 is not supported.");
	}

	/* Initialize GL objects needed to run the tests */
	initTest();

	/* Build iteration array to run the tests in an automated manner */
	const Utils::_variable_type variable_types[] = { Utils::VARIABLE_TYPE_DMAT2,   Utils::VARIABLE_TYPE_DMAT2X3,
													 Utils::VARIABLE_TYPE_DMAT2X4, Utils::VARIABLE_TYPE_DMAT3,
													 Utils::VARIABLE_TYPE_DMAT3X2, Utils::VARIABLE_TYPE_DMAT3X4,
													 Utils::VARIABLE_TYPE_DMAT4,   Utils::VARIABLE_TYPE_DMAT4X2,
													 Utils::VARIABLE_TYPE_DMAT4X3, Utils::VARIABLE_TYPE_DOUBLE,
													 Utils::VARIABLE_TYPE_DVEC2,   Utils::VARIABLE_TYPE_DVEC3,
													 Utils::VARIABLE_TYPE_DVEC4 };
	const unsigned int n_variable_types = sizeof(variable_types) / sizeof(variable_types[0]);

	for (unsigned int n_variable_type = 0; n_variable_type < n_variable_types; ++n_variable_type)
	{
		const Utils::_variable_type variable_type = variable_types[n_variable_type];

		/* Construct a set of argument lists valid for the variable type considered */
		_argument_lists argument_lists = getArgumentListsForVariableType(variable_type);

		for (_argument_lists_const_iterator argument_list_iterator = argument_lists.begin();
			 argument_list_iterator != argument_lists.end(); argument_list_iterator++)
		{
			/* Constructor thwe test case descriptor */
			_test_case test_case;

			test_case.argument_list = *argument_list_iterator;
			test_case.type			= variable_type;

			/* Initialize a program object we will use to perform the casting */
			initIteration(test_case);

			/* See if the shader compiles. */
			m_has_test_passed &= executeIteration(test_case);
		} /* for (all argument lists) */
	}	 /* for (all variable types) */

	/* We're done */
	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}